

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_c11_unittests.cc
# Opt level: O0

void __thiscall
DenseHashMapMoveTest_Emplace_ValueMoveCount_Test::TestBody
          (DenseHashMapMoveTest_Emplace_ValueMoveCount_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  h;
  key_type *in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  undefined1 uVar3;
  key_equal *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  undefined1 uVar4;
  char *in_stack_fffffffffffffe98;
  int line;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  undefined1 uVar5;
  undefined8 in_stack_fffffffffffffea8;
  Type type;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 uVar6;
  AssertionResult local_128 [2];
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 uVar7;
  AssertHelper *in_stack_ffffffffffffff00;
  AssertionResult local_d8;
  uint local_c4;
  undefined4 local_ac;
  AssertionResult local_a8 [3];
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  libc_allocator_with_realloc<std::pair<const_int,_A>_> local_5b [91];
  
  type = (Type)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  google::libc_allocator_with_realloc<std::pair<const_int,_A>_>::libc_allocator_with_realloc
            (local_5b);
  google::
  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  ::dense_hash_map((dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                    *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                   (size_type)in_stack_fffffffffffffe98,
                   (hasher *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                   in_stack_fffffffffffffe88,
                   (allocator_type *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  google::libc_allocator_with_realloc<std::pair<const_int,_A>_>::~libc_allocator_with_realloc
            (local_5b);
  local_70 = 0;
  google::
  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  ::set_empty_key((dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                   *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                  in_stack_fffffffffffffe78);
  A::reset();
  local_74 = 1;
  local_78 = 2;
  google::
  dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>
  ::emplace<int,int>((dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                      *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                     (int *)in_stack_fffffffffffffe88,
                     (int *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  local_ac = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffe98,
             (char *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
             (int *)in_stack_fffffffffffffe88,
             (int *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a8);
  uVar6 = bVar1;
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT17(bVar1,in_stack_fffffffffffffeb0));
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x107aca9);
    type = (Type)((ulong)pcVar2 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffeb0),type,
               (char *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
               (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff00,
               (Message *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
    testing::Message::~Message((Message *)0x107ad06);
  }
  local_c4 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x107ad74);
  if (local_c4 == 0) {
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffffe98,
               (char *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
               (int *)in_stack_fffffffffffffe88,
               (int *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d8);
    uVar5 = bVar1;
    if (!bVar1) {
      testing::Message::Message((Message *)CONCAT17(uVar6,in_stack_fffffffffffffeb0));
      in_stack_fffffffffffffe98 =
           testing::AssertionResult::failure_message((AssertionResult *)0x107ae25);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffeb0),type,
                 (char *)CONCAT17(uVar5,in_stack_fffffffffffffea0),
                 (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff00,
                 (Message *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
      testing::Message::~Message((Message *)0x107ae82);
    }
    local_c4 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x107aef0);
    if (local_c4 == 0) {
      uVar7 = 0;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffe98,
                 (char *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                 (int *)in_stack_fffffffffffffe88,
                 (int *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xffffffffffffff00);
      uVar4 = bVar1;
      if (!bVar1) {
        testing::Message::Message((Message *)CONCAT17(uVar6,in_stack_fffffffffffffeb0));
        in_stack_fffffffffffffe88 =
             (key_equal *)testing::AssertionResult::failure_message((AssertionResult *)0x107af9e);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffeb0),type,
                   (char *)CONCAT17(uVar5,in_stack_fffffffffffffea0),
                   (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                   (char *)CONCAT17(uVar4,in_stack_fffffffffffffe90));
        testing::internal::AssertHelper::operator=
                  (in_stack_ffffffffffffff00,(Message *)CONCAT44(uVar7,in_stack_fffffffffffffef8));
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
        testing::Message::~Message((Message *)0x107afec);
      }
      local_c4 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x107b051);
      if (local_c4 == 0) {
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  (in_stack_fffffffffffffe98,(char *)CONCAT17(uVar4,in_stack_fffffffffffffe90),
                   (int *)in_stack_fffffffffffffe88,
                   (int *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
        line = (int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_128);
        if (!bVar1) {
          uVar3 = bVar1;
          testing::Message::Message((Message *)CONCAT17(uVar6,in_stack_fffffffffffffeb0));
          testing::AssertionResult::failure_message((AssertionResult *)0x107b0f0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffeb0),type,
                     (char *)CONCAT17(uVar5,in_stack_fffffffffffffea0),line,
                     (char *)CONCAT17(uVar4,in_stack_fffffffffffffe90));
          testing::internal::AssertHelper::operator=
                    (in_stack_ffffffffffffff00,(Message *)CONCAT44(uVar7,in_stack_fffffffffffffef8))
          ;
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffffe80));
          testing::Message::~Message((Message *)0x107b13c);
        }
        local_c4 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x107b19e);
        if (local_c4 == 0) {
          local_c4 = 0;
        }
      }
    }
  }
  google::
  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  ::~dense_hash_map((dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                     *)0x107b1c3);
  return;
}

Assistant:

TEST(DenseHashMapMoveTest, Emplace_ValueMoveCount)
{
    dense_hash_map<int, A> h;
    h.set_empty_key(0);

    A::reset();
    h.emplace(1, 2);

    ASSERT_EQ(0, A::copy_ctor);
    ASSERT_EQ(0, A::copy_assign);
    ASSERT_EQ(0, A::move_ctor);
    ASSERT_EQ(0, A::move_assign);
}